

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O2

int16_t __thiscall BoxNesting::KuhnAlgorithm::runAlgorithm(KuhnAlgorithm *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  _Bvector_impl *p_Var3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  int16_t i;
  size_type __n;
  byte bVar8;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar9;
  bool local_29;
  
  do {
    p_Var3 = &(this->used).super__Bvector_base<std::allocator<bool>_>._M_impl;
    uVar1 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar2 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last.super__Bit_iterator_base._M_offset = uVar2;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
    local_29 = false;
    __n = 0;
    __first.super__Bit_iterator_base._8_8_ = 0;
    __first.super__Bit_iterator_base._M_p =
         (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last.super__Bit_iterator_base._12_4_ = 0;
    std::__fill_a1(__first,__last,&local_29);
    bVar8 = 0;
    while( true ) {
      uVar5 = (ulong)this->leftVerticesCount;
      if ((long)uVar5 <= (long)__n) break;
      if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[__n] == -1) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used,__n);
        if ((*rVar9._M_p & rVar9._M_mask) == 0) {
          bVar4 = kuhn(this,(int16_t)__n);
          bVar8 = bVar8 | bVar4;
        }
      }
      __n = __n + 1;
    }
  } while (bVar8 != 0);
  uVar7 = this->rightVerticesCount;
  uVar6 = 0;
  if ((short)uVar7 < 1) {
    uVar7 = 0;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = (ulong)((int)uVar5 -
                   (uint)((this->pairsRight).super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar6] != -1));
  }
  return (int16_t)uVar5;
}

Assistant:

int16_t KuhnAlgorithm::runAlgorithm() const
{
	bool pathFound;
	do {
		fill(this->used.begin(), this->used.end(), false);
		pathFound = false;
		// remember to start only from free vertices which are not visited yet
		for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
			if (this->pairsLeft[i] == -1 && !this->used[i]) {
				pathFound |= kuhn(i);
			}
		}
	} while (pathFound);

	// We have the same amount of visible boxes as there
	// are vertices in the left part of the bipartite graph
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;
	for (int16_t i = 0; i < this->rightVerticesCount; ++i) {
		if (this->pairsRight[i] != -1) {
			--visibleBoxes;
		}
	}

	return visibleBoxes;
}